

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

hashnode * set_hashnode(hashtable *table,void *label,void *record,_Bool *exist)

{
  ulong in_RAX;
  hashnode *phVar1;
  hashnode *phVar2;
  _Bool is_find;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  phVar1 = get_hashnode(table,label,(_Bool *)((long)&uStack_28 + 7));
  if (exist != (_Bool *)0x0) {
    *exist = uStack_28._7_1_;
  }
  if ((uStack_28 & 0x100000000000000) == 0) {
    phVar2 = (hashnode *)malloc(0x10);
    phVar1->next = phVar2;
    phVar2->next = (hashnode *)0x0;
  }
  else {
    phVar2 = phVar1;
    if (record == (void *)0x0) {
      return phVar1;
    }
  }
  phVar2->record = record;
  return phVar2;
}

Assistant:

hashnode* set_hashnode(hashtable* table,void *label,void*record,
                                bool* exist){
  // #if DEBUG == 1
  // printf("set_node:%d\n",*(int*)label);
  // #endif

  bool is_find =false;
  hashnode* node = get_hashnode(table,label,&is_find);
  if(exist)*exist=is_find;
  if (is_find){
    if(record!=NULL)node->record = record;
  }else{
    node->next = (hashnode *)malloc(sizeof(hashnode));
    node = node->next;
    node->next = NULL;//现在node是最后一个节点
    // node->id = table->hash(label) % table->size;
    //！！！即使record==NULL也会照样赋值。
    node->record = record;
  }
  return node;
}